

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O1

CURLcode ws_cw_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t nbytes)

{
  void *pvVar1;
  curl_trc_feat *pcVar2;
  bool bVar3;
  _Bool _Var4;
  CURLcode CVar5;
  ssize_t sVar6;
  size_t sVar7;
  ws_decoder *dec;
  bufq *q;
  CURLcode result;
  ws_cw_dec_ctx pass_ctx;
  CURLcode local_60;
  CURLcode local_5c;
  void *local_58;
  Curl_easy *local_50;
  void *local_48;
  Curl_cwriter *local_40;
  int local_38;
  
  if (((type & 1U) == 0) || (((data->set).field_0x8a2 & 0x80) != 0)) {
    CVar5 = Curl_cwriter_write(data,writer->next,type,buf,nbytes);
    return CVar5;
  }
  pvVar1 = writer->ctx;
  local_58 = Curl_conn_meta_get(data->conn,"meta:proto:ws:conn");
  if (local_58 == (void *)0x0) {
    Curl_failf(data,"WS: not a websocket transfer");
    local_60 = CURLE_FAILED_INIT;
  }
  else {
    if (nbytes != 0) {
      sVar6 = Curl_bufq_write((bufq *)((long)pvVar1 + 0x20),(uchar *)buf,nbytes,&local_5c);
      if (sVar6 < 0) {
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))
           )) {
          Curl_infof(data,"WS: error adding data to buffer %d",(ulong)local_5c);
        }
        local_60 = local_5c;
      }
      if (sVar6 < 0) {
        return local_60;
      }
    }
    q = (bufq *)((long)pvVar1 + 0x20);
    dec = (ws_decoder *)((long)local_58 + 8);
    do {
      _Var4 = Curl_bufq_is_empty(q);
      if (_Var4) {
        if (-1 < (char)type) {
          return CURLE_OK;
        }
        _Var4 = Curl_bufq_is_empty(q);
        if (_Var4) {
          return CURLE_OK;
        }
        if ((data == (Curl_easy *)0x0) || (((data->set).field_0x89f & 0x40) == 0)) {
          return CURLE_RECV_ERROR;
        }
        pcVar2 = (data->state).feat;
        if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
          return CURLE_RECV_ERROR;
        }
        sVar7 = Curl_bufq_len(q);
        Curl_infof(data,"WS: decode ending with %zd frame bytes remaining",sVar7);
        return CURLE_RECV_ERROR;
      }
      local_48 = local_58;
      local_40 = writer->next;
      local_50 = data;
      local_38 = type;
      local_5c = ws_dec_pass(dec,data,q,ws_cw_dec_next,&local_50);
      if (local_5c == CURLE_OK) {
        bVar3 = true;
      }
      else if (local_5c == CURLE_AGAIN) {
        if (data != (Curl_easy *)0x0) {
          bVar3 = false;
          local_60 = CURLE_OK;
          if (((data->set).field_0x89f & 0x40) == 0) goto LAB_0016bce4;
          pcVar2 = (data->state).feat;
          if (pcVar2 == (curl_trc_feat *)0x0) {
            if (0 < Curl_trc_feat_write.log_level) {
LAB_0016bcc3:
              Curl_trc_write(data,"websocket, buffered incomplete frame head");
            }
          }
          else {
            bVar3 = false;
            if (0 < pcVar2->log_level) {
              local_60 = CURLE_OK;
              if (0 < Curl_trc_feat_write.log_level) goto LAB_0016bcc3;
              goto LAB_0016bce4;
            }
          }
        }
        bVar3 = false;
        local_60 = CURLE_OK;
      }
      else {
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))
           )) {
          Curl_infof(data,"WS: decode error %d",(ulong)local_5c);
        }
        local_60 = local_5c;
        bVar3 = false;
      }
LAB_0016bce4:
    } while (bVar3);
  }
  return local_60;
}

Assistant:

static CURLcode ws_cw_write(struct Curl_easy *data,
                            struct Curl_cwriter *writer, int type,
                            const char *buf, size_t nbytes)
{
  struct ws_cw_ctx *ctx = writer->ctx;
  struct websocket *ws;
  CURLcode result;

  if(!(type & CLIENTWRITE_BODY) || data->set.ws_raw_mode)
    return Curl_cwriter_write(data, writer->next, type, buf, nbytes);

  ws = Curl_conn_meta_get(data->conn, CURL_META_PROTO_WS_CONN);
  if(!ws) {
    failf(data, "WS: not a websocket transfer");
    return CURLE_FAILED_INIT;
  }

  if(nbytes) {
    ssize_t nwritten;
    nwritten = Curl_bufq_write(&ctx->buf, (const unsigned char *)buf,
                               nbytes, &result);
    if(nwritten < 0) {
      infof(data, "WS: error adding data to buffer %d", result);
      return result;
    }
  }

  while(!Curl_bufq_is_empty(&ctx->buf)) {
    struct ws_cw_dec_ctx pass_ctx;
    pass_ctx.data = data;
    pass_ctx.ws = ws;
    pass_ctx.next_writer = writer->next;
    pass_ctx.cw_type = type;
    result = ws_dec_pass(&ws->dec, data, &ctx->buf,
                         ws_cw_dec_next, &pass_ctx);
    if(result == CURLE_AGAIN) {
      /* insufficient amount of data, keep it for later.
       * we pretend to have written all since we have a copy */
      CURL_TRC_WRITE(data, "websocket, buffered incomplete frame head");
      return CURLE_OK;
    }
    else if(result) {
      infof(data, "WS: decode error %d", (int)result);
      return result;
    }
  }

  if((type & CLIENTWRITE_EOS) && !Curl_bufq_is_empty(&ctx->buf)) {
    infof(data, "WS: decode ending with %zd frame bytes remaining",
          Curl_bufq_len(&ctx->buf));
    return CURLE_RECV_ERROR;
  }

  return CURLE_OK;
}